

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O3

int __thiscall FIX::FieldMap::calculateTotal(FieldMap *this,int checkSumField)

{
  int iVar1;
  pointer pFVar2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  pointer this_00;
  _Base_ptr p_Var5;
  
  this_00 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 == pFVar2) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      if (this_00->m_tag != checkSumField) {
        FieldBase::calculate(this_00);
        iVar4 = iVar4 + (this_00->m_metrics).m_checksum;
        pFVar2 = (this->m_fields).
                 super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pFVar2);
  }
  for (p_Var3 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    for (p_Var5 = p_Var3[1]._M_parent; p_Var5 != p_Var3[1]._M_left;
        p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
      iVar1 = calculateTotal(*(FieldMap **)p_Var5,10);
      iVar4 = iVar4 + iVar1;
    }
  }
  return iVar4;
}

Assistant:

int FieldMap::calculateTotal( int checkSumField ) const
{
  int result = 0;
  Fields::const_iterator i;
  for ( i = m_fields.begin(); i != m_fields.end(); ++i )
  {
    if ( i->getTag() != checkSumField )
      result += i->getTotal();
  }

  Groups::const_iterator j;
  for ( j = m_groups.begin(); j != m_groups.end(); ++j )
  {
    std::vector < FieldMap* > ::const_iterator k;
    for ( k = j->second.begin(); k != j->second.end(); ++k )
      result += ( *k ) ->calculateTotal();
  }
  return result;
}